

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O3

void Console::Prompt::Private::handleWinch(int sig)

{
  uint64 event;
  undefined8 local_8;
  
  if (resizeEventFd != 0) {
    local_8 = 1;
    write(resizeEventFd,&local_8,8);
  }
  return;
}

Assistant:

static void handleWinch(int sig)
  {
#ifndef __CYGWIN__
    int eventFd = resizeEventFd;
#else
    int eventFd = resizeEventFdWrite;
#endif
    if(eventFd)
    {
      uint64 event = 1;
      if(write(eventFd, &event, sizeof(uint64)) != sizeof(uint64))
        return;
    }
  }